

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O0

void ly_load_plugins_dir(DIR *dir,char *dir_path,int ext_or_type)

{
  int iVar1;
  void *node;
  undefined8 uVar2;
  char *pcVar3;
  int local_4c;
  int ret;
  void *dlhandler;
  char *name;
  char *str;
  size_t len;
  dirent *file;
  char *pcStack_18;
  int ext_or_type_local;
  char *dir_path_local;
  DIR *dir_local;
  
  file._4_4_ = ext_or_type;
  pcStack_18 = dir_path;
  dir_path_local = (char *)dir;
  do {
    while( true ) {
      while( true ) {
        do {
          len = (size_t)readdir((DIR *)dir_path_local);
          if ((dirent *)len == (dirent *)0x0) {
            return;
          }
          str = (char *)strlen(((dirent *)len)->d_name);
        } while ((str < (char *)0x4) || (iVar1 = strcmp(str + len + 0x10,".so"), iVar1 != 0));
        iVar1 = asprintf(&name,"%s/%s",pcStack_18,len + 0x13);
        if (iVar1 == -1) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "ly_load_plugins_dir");
          return;
        }
        node = (void *)dlopen(name);
        pcVar3 = name;
        if (node != (void *)0x0) break;
        uVar2 = dlerror();
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Loading \"%s\" as a plugin failed (%s).",pcVar3,uVar2
              );
        free(name);
      }
      iVar1 = ly_set_contains(&dlhandlers,node);
      if (iVar1 == -1) break;
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Plugin \"%s\" already loaded.",name);
      free(name);
      dlclose(node);
    }
    dlerror();
    pcVar3 = strndup((char *)(len + 0x13),(size_t)(str + -3));
    if (pcVar3 == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_load_plugins_dir"
            );
      dlclose(node);
      free(name);
      return;
    }
    if (file._4_4_ == 0) {
      local_4c = lytype_load_plugin(node,pcVar3);
    }
    else {
      local_4c = lyext_load_plugin(node,pcVar3);
    }
    if (local_4c == 0) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Plugin \"%s\" successfully loaded.",name);
      ly_add_loaded_plugin(pcVar3);
      ly_set_add(&dlhandlers,node,1);
    }
    else {
      free(pcVar3);
      dlclose(node);
    }
    free(name);
  } while (local_4c != -1);
  return;
}

Assistant:

static void
ly_load_plugins_dir(DIR *dir, const char *dir_path, int ext_or_type)
{
    struct dirent *file;
    size_t len;
    char *str, *name;
    void *dlhandler;
    int ret;

#ifdef STATIC
    return;
#endif /* STATIC */

    while ((file = readdir(dir))) {
        /* required format of the filename is *LY_PLUGIN_SUFFIX */
        len = strlen(file->d_name);
        if (len < LY_PLUGIN_SUFFIX_LEN + 1 ||
                strcmp(&file->d_name[len - LY_PLUGIN_SUFFIX_LEN], LY_PLUGIN_SUFFIX)) {
            continue;
        }

        /* and construct the filepath */
        if (asprintf(&str, "%s/%s", dir_path, file->d_name) == -1) {
            LOGMEM(NULL);
            return;
        }

        /* load the plugin */
        dlhandler = dlopen(str, RTLD_NOW);
        if (!dlhandler) {
            LOGERR(NULL, LY_ESYS, "Loading \"%s\" as a plugin failed (%s).", str, dlerror());
            free(str);
            continue;
        }
        if (ly_set_contains(&dlhandlers, dlhandler) != -1) {
            /* the plugin is already loaded */
            LOGVRB("Plugin \"%s\" already loaded.", str);
            free(str);

            /* keep the refcount of the shared object correct */
            dlclose(dlhandler);
            continue;
        }
        dlerror();    /* Clear any existing error */

        /* store the name without the suffix */
        name = strndup(file->d_name, len - LY_PLUGIN_SUFFIX_LEN);
        if (!name) {
            LOGMEM(NULL);
            dlclose(dlhandler);
            free(str);
            return;
        }

        if (ext_or_type) {
            ret = lyext_load_plugin(dlhandler, name);
        } else {
            ret = lytype_load_plugin(dlhandler, name);
        }
        if (!ret) {
            LOGVRB("Plugin \"%s\" successfully loaded.", str);
            /* spends name */
            ly_add_loaded_plugin(name);
            /* keep the handler */
            ly_set_add(&dlhandlers, dlhandler, LY_SET_OPT_USEASLIST);
        } else {
            free(name);
            dlclose(dlhandler);
        }
        free(str);

        if (ret == -1) {
            /* finish on error */
            break;
        }
    }
}